

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jcmainct.c
# Opt level: O1

void start_pass_main(j_compress_ptr cinfo,J_BUF_MODE pass_mode)

{
  jpeg_c_main_controller *pjVar1;
  jpeg_error_mgr *pjVar2;
  
  if (cinfo->raw_data_in != 0) {
    return;
  }
  pjVar1 = cinfo->main;
  if (pass_mode != JBUF_PASS_THRU) {
    pjVar2 = cinfo->err;
    pjVar2->msg_code = 4;
    (*pjVar2->error_exit)((j_common_ptr)cinfo);
  }
  pjVar1[1].start_pass = (_func_void_j_compress_ptr_J_BUF_MODE *)0x0;
  *(undefined4 *)&pjVar1[1].process_data = 0;
  *(J_BUF_MODE *)((long)&pjVar1[1].process_data + 4) = pass_mode;
  pjVar1->process_data = process_data_simple_main;
  return;
}

Assistant:

METHODDEF(void)
start_pass_main(j_compress_ptr cinfo, J_BUF_MODE pass_mode)
{
  my_main_ptr main_ptr = (my_main_ptr)cinfo->main;

  /* Do nothing in raw-data mode. */
  if (cinfo->raw_data_in)
    return;

  if (pass_mode != JBUF_PASS_THRU)
    ERREXIT(cinfo, JERR_BAD_BUFFER_MODE);

  main_ptr->cur_iMCU_row = 0;   /* initialize counters */
  main_ptr->rowgroup_ctr = 0;
  main_ptr->suspended = FALSE;
  main_ptr->pass_mode = pass_mode;      /* save mode for use by process_data */
  main_ptr->pub.process_data = process_data_simple_main;
}